

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

LPSTR UTIL_WCToMB_Alloc(LPCWSTR lpWideCharStr,int cchWideChar)

{
  FILE *__stream;
  int iVar1;
  DWORD DVar2;
  LPSTR lpMultiByteStr;
  int *piVar3;
  
  iVar1 = WideCharToMultiByte(0,0,lpWideCharStr,cchWideChar,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar1 == 0) {
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_001fc268:
      abort();
    }
    GetLastError();
  }
  else {
    lpMultiByteStr = (LPSTR)PAL_malloc((long)iVar1);
    if (lpMultiByteStr == (LPSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001fc268;
      piVar3 = __errno_location();
      strerror(*piVar3);
      SetLastError(8);
    }
    else {
      iVar1 = WideCharToMultiByte(0,0,lpWideCharStr,cchWideChar,lpMultiByteStr,iVar1,(LPCSTR)0x0,
                                  (LPBOOL)0x0);
      if (iVar1 != 0) {
        return lpMultiByteStr;
      }
      fprintf(_stderr,"] %s %s:%d","UTIL_WCToMB_Alloc",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/utils.cpp"
              ,0xc9);
      __stream = _stderr;
      DVar2 = GetLastError();
      fprintf(__stream,"WCToMB error; GetLastError returns %#x\n",(ulong)DVar2);
      PAL_free(lpMultiByteStr);
    }
  }
  return (LPSTR)0x0;
}

Assistant:

LPSTR UTIL_WCToMB_Alloc(LPCWSTR lpWideCharStr, int cchWideChar)
{
    int length;
    LPSTR lpMultiByteStr;

    /* get required buffer length */
    length = WideCharToMultiByte(CP_ACP, 0, lpWideCharStr, cchWideChar, 
                                 NULL, 0, NULL, NULL);
    if(0 == length)
    {
        ERROR("WCToMB error; GetLastError returns %#x", GetLastError());
        return NULL;
    }

    /* allocate required buffer */
    lpMultiByteStr = (LPSTR)PAL_malloc(length);
    if(NULL == lpMultiByteStr)
    {
        ERROR("malloc() failed! errno is %d (%s)\n", errno,strerror(errno));
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return NULL;
    }

    /* convert into allocated buffer */
    length = WideCharToMultiByte(CP_ACP, 0, lpWideCharStr, cchWideChar, 
                                 lpMultiByteStr, length, NULL, NULL);
    if(0 == length)
    {
        ASSERT("WCToMB error; GetLastError returns %#x\n", GetLastError());
        PAL_free(lpMultiByteStr);
        return NULL;
    }
    return lpMultiByteStr;
}